

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompileType<char>(void)

{
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> st;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> i;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> s;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_1f;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_1e;
  SafeInt local_1d;
  Foo local_1c;
  
  local_1d = (SafeInt)0x0;
  local_1c = Foo1;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<Foo>
            (&local_1e,&local_1c);
  local_1f.m_int = '\0';
  CompiledMixedType<char,char>();
  CompiledMixedType<char,signed_char>();
  CompiledMixedType<char,unsigned_char>();
  CompiledMixedType<char,short>();
  CompiledMixedType<char,unsigned_short>();
  CompiledMixedType<char,int>();
  CompiledMixedType<char,unsigned_int>();
  CompiledMixedType<char,long>();
  CompiledMixedType<char,unsigned_long>();
  CompiledMixedType<char,long_long>();
  CompiledMixedType<char,unsigned_long_long>();
  ModulusFriendTest<char,char>();
  ModulusFriendTest<char,signed_char>();
  ModulusFriendTest<char,unsigned_char>();
  ModulusFriendTest<char,short>();
  ModulusFriendTest<char,unsigned_short>();
  ModulusFriendTest<char,int>();
  ModulusFriendTest<char,unsigned_int>();
  ModulusFriendTest<char,long>();
  ModulusFriendTest<char,unsigned_long>();
  ModulusFriendTest<char,long_long>();
  ModulusFriendTest<char,unsigned_long_long>();
  SafeInt::operator_cast_to_unsigned_long(&local_1d);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator++(&local_1f,0);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator++(&local_1f);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator--(&local_1f,0);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator--(&local_1f);
  return;
}

Assistant:

void CompileType()
{
	// Test constructors
	SafeInt<T> s;
	SafeInt<T> i(Foo::Foo1);
	T t = 0;
	SafeInt<T> st(t);
	SafeInt<T> sb(false);

	// Mixed operations
	CompiledMixedType<T, char>();
	CompiledMixedType<T, signed char>();
	CompiledMixedType<T, unsigned char>();
	CompiledMixedType<T, short>();
	CompiledMixedType<T, unsigned short>();
	CompiledMixedType<T, int>();
	CompiledMixedType<T, unsigned int>();
	CompiledMixedType<T, long>();
	CompiledMixedType<T, unsigned long>();
	CompiledMixedType<T, long long>();
	CompiledMixedType<T, unsigned long long>();

	// This is making trouble for the compiler
	ModulusFriendTest<T, char>();
	ModulusFriendTest<T, signed char>();
	ModulusFriendTest<T, unsigned char>();
	ModulusFriendTest<T, short>();
	ModulusFriendTest<T, unsigned short>();
	ModulusFriendTest<T, int>();
	ModulusFriendTest<T, unsigned int>();
	ModulusFriendTest<T, long>();
	ModulusFriendTest<T, unsigned long>();
	ModulusFriendTest<T, long long>();
	ModulusFriendTest<T, unsigned long long>();
	
	// Special case casts
	bool b = (bool)s;
	wchar_t w = (wchar_t)s;
	size_t size = (size_t)s;
	float f = (float)s;
	double d = (double)s;
	long double ld = (long double)s;

	// Pointer operations
	T* p1 = s.Ptr();
	const T* p2 = s.Ptr();
	const T& r = s.Ref();
	T* p3 = &s;
	const T* p4 = &s;

	// Unary operators
	bool b2 = !st;
	t = +st;

	st++;
	++st;
	st--;
	--st;
	t = ~st;

	// Get compile time coverage of negation
	T x = 1;
	T result;

	(void)SafeNegation(x, result);

}